

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O2

int __thiscall CSnapshot::Serialize(CSnapshot *this,char *pDstData)

{
  int iVar1;
  
  *(int *)pDstData = this->m_DataSize;
  iVar1 = this->m_NumItems;
  *(int *)(pDstData + 4) = iVar1;
  mem_copy(pDstData + 8,&this[1].m_DataSize + iVar1,iVar1 * 4);
  mem_copy(pDstData + (long)this->m_NumItems * 4 + 8,this + (long)this->m_NumItems + 1,
           this->m_DataSize);
  return this->m_DataSize + this->m_NumItems * 4 + 8;
}

Assistant:

int CSnapshot::Serialize(char *pDstData) const
{
	int *pData = (int*)pDstData;
	pData[0] = m_DataSize;
	pData[1] = m_NumItems;

	mem_copy(pData+2, Offsets(), sizeof(int)*m_NumItems);
	mem_copy(pData+2+m_NumItems, DataStart(), m_DataSize);

	return sizeof(int) * (2 + m_NumItems) + m_DataSize;
}